

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

Error * ot::commissioner::CommissionerImpl::EncodeBbrDataset
                  (Error *__return_storage_ptr__,Request *aRequest,BbrDataset *aDataset)

{
  BbrDataset *pBVar1;
  bool bVar2;
  Error *pEVar3;
  ByteArray *aValue;
  ErrorCode local_164;
  Tlv local_160;
  Error local_140;
  ErrorCode local_114;
  Error local_110;
  undefined1 local_e8 [8];
  Address addr;
  Tlv local_c8;
  Error local_a8;
  ErrorCode local_80 [4];
  Tlv local_70;
  Error local_50;
  byte local_21;
  BbrDataset *local_20;
  BbrDataset *aDataset_local;
  Request *aRequest_local;
  Error *error;
  
  local_21 = 0;
  local_20 = aDataset;
  aDataset_local = (BbrDataset *)aRequest;
  aRequest_local = (Request *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  pBVar1 = aDataset_local;
  if ((local_20->mPresentFlags & 0x8000) == 0) {
LAB_0024a116:
    pBVar1 = aDataset_local;
    if ((local_20->mPresentFlags & 0x4000) != 0) {
      tlv::Tlv::Tlv(&local_c8,kRegistrarHostname,&local_20->mRegistrarHostname,kMeshCoP);
      AppendTlv(&local_a8,(Message *)pBVar1,&local_c8);
      pEVar3 = Error::operator=(__return_storage_ptr__,&local_a8);
      addr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      bVar2 = commissioner::operator!=
                        (pEVar3,(ErrorCode *)
                                ((long)&addr.mBytes.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      Error::~Error(&local_a8);
      tlv::Tlv::~Tlv(&local_c8);
      if (bVar2) goto LAB_0024a415;
    }
    if ((local_20->mPresentFlags & 0x2000) != 0) {
      Address::Address((Address *)local_e8);
      Address::Set(&local_110,(Address *)local_e8,&local_20->mRegistrarIpv6Addr);
      pEVar3 = Error::operator=(__return_storage_ptr__,&local_110);
      local_114 = kNone;
      bVar2 = commissioner::operator!=(pEVar3,&local_114);
      Error::~Error(&local_110);
      pBVar1 = aDataset_local;
      if (bVar2) {
        bVar2 = true;
      }
      else {
        aValue = Address::GetRaw((Address *)local_e8);
        tlv::Tlv::Tlv(&local_160,kRegistrarIpv6Address,aValue,kMeshCoP);
        AppendTlv(&local_140,(Message *)pBVar1,&local_160);
        pEVar3 = Error::operator=(__return_storage_ptr__,&local_140);
        local_164 = kNone;
        bVar2 = commissioner::operator!=(pEVar3,&local_164);
        Error::~Error(&local_140);
        tlv::Tlv::~Tlv(&local_160);
        if (bVar2) {
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
      }
      Address::~Address((Address *)local_e8);
      if ((bVar2) && (!bVar2)) goto LAB_0024a423;
    }
  }
  else {
    tlv::Tlv::Tlv(&local_70,kTriHostname,&local_20->mTriHostname,kMeshCoP);
    AppendTlv(&local_50,(Message *)pBVar1,&local_70);
    pEVar3 = Error::operator=(__return_storage_ptr__,&local_50);
    local_80[0] = kNone;
    bVar2 = commissioner::operator!=(pEVar3,local_80);
    Error::~Error(&local_50);
    tlv::Tlv::~Tlv(&local_70);
    if (!bVar2) goto LAB_0024a116;
  }
LAB_0024a415:
  local_21 = 1;
LAB_0024a423:
  if ((local_21 & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::EncodeBbrDataset(coap::Request &aRequest, const BbrDataset &aDataset)
{
    Error error;

    if (aDataset.mPresentFlags & BbrDataset::kTriHostnameBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kTriHostname, aDataset.mTriHostname}));
    }

    if (aDataset.mPresentFlags & BbrDataset::kRegistrarHostnameBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kRegistrarHostname, aDataset.mRegistrarHostname}));
    }

    if (aDataset.mPresentFlags & BbrDataset::kRegistrarIpv6AddrBit)
    {
        Address addr;

        SuccessOrExit(error = addr.Set(aDataset.mRegistrarIpv6Addr));
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kRegistrarIpv6Address, addr.GetRaw()}));
    }

exit:
    return error;
}